

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

void __thiscall spvtools::opt::Loop::SetLatchBlock(Loop *this,BasicBlock *latch)

{
  Instruction *this_00;
  uint32_t uVar1;
  size_type sVar2;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (latch->function_ == (Function *)0x0) {
    __assert_fail("latch->GetParent() && \"The basic block does not belong to a function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x123,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
  }
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:294:38)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp:294:38)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  BasicBlock::ForEachSuccessorLabel(latch,(function<void_(unsigned_int)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  this_00 = (latch->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar1 = 0;
  if (this_00->has_result_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  }
  local_38._0_4_ = uVar1;
  sVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->loop_basic_blocks_)._M_h,(key_type *)local_38._M_pod_data);
  if (sVar2 != 0) {
    this->loop_latch_ = latch;
    return;
  }
  __assert_fail("IsInsideLoop(latch) && \"The continue block is not in the loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,299,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
}

Assistant:

void Loop::SetLatchBlock(BasicBlock* latch) {
#ifndef NDEBUG
  assert(latch->GetParent() && "The basic block does not belong to a function");

  const auto* const_latch = latch;
  const_latch->ForEachSuccessorLabel([this](uint32_t id) {
    assert((!IsInsideLoop(id) || id == GetHeaderBlock()->id()) &&
           "A predecessor of the continue block does not belong to the loop");
  });
#endif  // NDEBUG
  assert(IsInsideLoop(latch) && "The continue block is not in the loop");

  SetLatchBlockImpl(latch);
}